

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid,REF_INT id,REF_DBL *sign)

{
  double *pdVar1;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_STATUS RVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  int cell;
  REF_DBL uv_area;
  REF_INT nodes [27];
  
  ref_geom = ref_grid->geom;
  if (ref_geom->uv_area_sign == (REF_DBL *)0x0) {
    ref_cell = ref_grid->cell[3];
    uVar3 = ref_geom->nface;
    if (uVar3 == 0xffffffff) {
      uVar3 = ref_geom_infer_nedge_nface(ref_grid);
      if (uVar3 != 0) {
        pcVar9 = "infer counts";
        uVar7 = 0x117;
LAB_0014d81b:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar7,"ref_geom_uv_area_sign",(ulong)uVar3,pcVar9);
        return uVar3;
      }
      uVar3 = ref_geom->nface;
    }
    if ((int)uVar3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x118,
             "ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL negative");
      return 1;
    }
    pRVar4 = (REF_DBL *)malloc((ulong)uVar3 * 8);
    ref_geom->uv_area_sign = pRVar4;
    if (pRVar4 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x118,
             "ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL NULL");
      return 2;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      pRVar4[uVar5] = 0.0;
    }
    for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
      RVar2 = ref_cell_nodes(ref_cell,cell,nodes);
      if (((RVar2 == 0) && (lVar8 = (long)nodes[3], 0 < lVar8)) && (nodes[3] <= ref_geom->nface)) {
        uVar3 = ref_geom_uv_area(ref_geom,nodes,&uv_area);
        if (uVar3 != 0) {
          pcVar9 = "uv area";
          uVar7 = 0x11c;
          goto LAB_0014d81b;
        }
        ref_geom->uv_area_sign[lVar8 + -1] =
             ref_geom->uv_area_sign[lVar8 + -1] +
             *(double *)(&DAT_0020f930 + (ulong)(uv_area < 0.0) * 8);
      }
    }
    uVar6 = 0;
    uVar5 = (ulong)(uint)ref_geom->nface;
    if (ref_geom->nface < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pdVar1 = ref_geom->uv_area_sign + uVar6;
      ref_geom->uv_area_sign[uVar6] =
           *(REF_DBL *)(&DAT_0020f930 + (ulong)(*pdVar1 <= 0.0 && *pdVar1 != 0.0) * 8);
    }
  }
  RVar2 = 3;
  if ((0 < id) && (id <= ref_geom->nface)) {
    *sign = ref_geom->uv_area_sign[(ulong)(uint)id - 1];
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid, REF_INT id,
                                         REF_DBL *sign) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  if (NULL == ((ref_geom)->uv_area_sign)) {
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_INT face;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL uv_area;
    if (REF_EMPTY == ref_geom->nface)
      RSS(ref_geom_infer_nedge_nface(ref_grid), "infer counts");
    ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 0.0);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      face = nodes[3];
      if (face < 1 || ref_geom->nface < face) continue;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      if (uv_area < 0.0) {
        ((ref_geom)->uv_area_sign)[face - 1] -= 1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face - 1] += 1.0;
      }
    }
    for (face = 0; face < ref_geom->nface; face++) {
      if (((ref_geom)->uv_area_sign)[face] < 0.0) {
        ((ref_geom)->uv_area_sign)[face] = -1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face] = 1.0;
      }
    }
  }

  if (id < 1 || id > ref_geom->nface) return REF_INVALID;
  *sign = ((ref_geom)->uv_area_sign)[id - 1];

  return REF_SUCCESS;
}